

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation
          (ConflictPoolPropagation *this,HighsInt conflictpoolindex,HighsDomain *domain,
          HighsConflictPool *conflictpool_)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  ConflictPoolPropagation *in_stack_ffffffffffffff78;
  HighsConflictPool *this_00;
  value_type_conflict2 *__x;
  undefined4 *__new_size;
  vector<int,_std::allocator<int>_> *this_01;
  
  *in_RDI = in_ESI;
  *(long *)(in_RDI + 2) = in_RDX;
  *(undefined8 *)(in_RDI + 4) = in_RCX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bb388);
  __x = in_RDI + 0xc;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bb39b);
  __new_size = in_RDI + 0x12;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5bb3ae);
  this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bb3c1);
  std::
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ::vector((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
            *)0x5bb3d4);
  HighsMipSolver::numCol(*(HighsMipSolver **)(in_RDX + 0x1d8));
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)__new_size,__x);
  this_00 = (HighsConflictPool *)(in_RDI + 0xc);
  HighsMipSolver::numCol(*(HighsMipSolver **)(in_RDX + 0x1d8));
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)__new_size,__x);
  HighsConflictPool::addPropagationDomain(this_00,in_stack_ffffffffffffff78);
  return;
}

Assistant:

HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation(
    HighsInt conflictpoolindex, HighsDomain* domain,
    HighsConflictPool& conflictpool_)
    : conflictpoolindex(conflictpoolindex),
      domain(domain),
      conflictpool_(&conflictpool_) {
  colLowerWatched_.resize(domain->mipsolver->numCol(), -1);
  colUpperWatched_.resize(domain->mipsolver->numCol(), -1);
  conflictpool_.addPropagationDomain(this);
}